

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinSerializer<std::tuple<int,bool,char,std::vector<int,std::allocator<int>>>,void>::
     serialize_elems<OutputStream,0ul,1ul,2ul,3ul>(void)

{
  OutputStream *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar1;
  
  uVar1 = 1;
  std::get<0ul,int,bool,char,std::vector<int,std::allocator<int>>>
            ((tuple<int,_bool,_char,_std::vector<int,_std::allocator<int>_>_> *)0x1d06f0);
  serialize<int,OutputStream>
            ((int *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  std::get<1ul,int,bool,char,std::vector<int,std::allocator<int>>>
            ((tuple<int,_bool,_char,_std::vector<int,_std::allocator<int>_>_> *)0x1d070f);
  serialize<bool,OutputStream>
            ((bool *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  std::get<2ul,int,bool,char,std::vector<int,std::allocator<int>>>
            ((tuple<int,_bool,_char,_std::vector<int,_std::allocator<int>_>_> *)0x1d072e);
  serialize<char,OutputStream>
            ((char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  std::get<3ul,int,bool,char,std::vector<int,std::allocator<int>>>
            ((tuple<int,_bool,_char,_std::vector<int,_std::allocator<int>_>_> *)0x1d074d);
  serialize<std::vector<int,std::allocator<int>>,OutputStream>
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void serialize_elems(const Tuple<E...>& t, OutputStream& ostream, std::index_sequence<I...>)
  {
    using swallow = int[];
    using std::get;
    (void)swallow{1, (mserialize::serialize(get<I>(t), ostream), int{})...};
  }